

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

bool __thiscall
EnvironmentNAVXYTHETALATTICE::InitializeEnv(EnvironmentNAVXYTHETALATTICE *this,char *sEnvFile)

{
  FILE *__stream;
  SBPL_Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  __stream = fopen(sEnvFile,"r");
  if (__stream != (FILE *)0x0) {
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x37])(this,__stream);
    fclose(__stream);
    (*(this->super_DiscreteSpaceInformation)._vptr_DiscreteSpaceInformation[0x3b])(this,0);
    return true;
  }
  this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SBPL has encountered a fatal error!",&local_39);
  SBPL_Exception::SBPL_Exception(this_00,&local_38);
  __cxa_throw(this_00,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool EnvironmentNAVXYTHETALATTICE::InitializeEnv(const char* sEnvFile)
{
    FILE* fCfg = fopen(sEnvFile, "r");
    if (fCfg == NULL) {
        SBPL_ERROR("ERROR: unable to open %s\n", sEnvFile);
        throw SBPL_Exception();
    }
    ReadConfiguration(fCfg);
    fclose(fCfg);

    InitGeneral( NULL);

    return true;
}